

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O0

void __thiscall
Diligent::VariableSizeAllocationsManager::DbgVerifyList(VariableSizeAllocationsManager *this)

{
  OffsetType OVar1;
  ulong uVar2;
  unsigned_long uVar3;
  bool bVar4;
  bool bVar5;
  Char *pCVar6;
  char (*pacVar7) [57];
  char (*Args_1) [57];
  pointer ppVar8;
  pointer ppVar9;
  char (*in_RCX) [30];
  VariableSizeAllocationsManager *Args_1_00;
  OffsetType *in_R8;
  char (*in_stack_fffffffffffffdc8) [9];
  undefined1 local_198 [8];
  string msg_9;
  string msg_8;
  _Self local_150;
  iterator OrderIt;
  string msg_7;
  undefined1 local_120 [8];
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  string msg_2;
  undefined1 local_78 [8];
  string msg_1;
  iterator PrevBlockIt;
  iterator BlockIt;
  undefined1 local_38 [8];
  string msg;
  OffsetType TotalFreeSize;
  VariableSizeAllocationsManager *this_local;
  
  msg.field_2._8_8_ = 0;
  bVar4 = IsPowerOfTwo<unsigned_long>(this->m_CurrAlignment);
  if (!bVar4) {
    FormatString<char[26],char[30]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(m_CurrAlignment)",in_RCX);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"DbgVerifyList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x1c3);
    std::__cxx11::string::~string((string *)local_38);
  }
  PrevBlockIt = std::
                map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                ::begin(&this->m_FreeBlocksByOffset);
  msg_1.field_2._8_8_ =
       std::
       map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
       ::end(&this->m_FreeBlocksByOffset);
  pacVar7 = (char (*) [57])
            std::
            map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
            ::size(&this->m_FreeBlocksByOffset);
  Args_1 = (char (*) [57])
           std::
           multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
           ::size(&this->m_FreeBlocksBySize);
  if (pacVar7 != Args_1) {
    FormatString<char[26],char[57]>
              ((string *)local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size()",Args_1);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"DbgVerifyList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x1c6);
    std::__cxx11::string::~string((string *)local_78);
  }
  while( true ) {
    msg_2.field_2._8_8_ =
         std::
         map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
         ::end(&this->m_FreeBlocksByOffset);
    bVar4 = std::operator!=(&PrevBlockIt,(_Self *)((long)&msg_2.field_2 + 8));
    if (!bVar4) break;
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
    ::operator->(&PrevBlockIt);
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&PrevBlockIt);
    uVar3 = ppVar9->first;
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&PrevBlockIt);
    if (this->m_MaxSize < uVar3 + (ppVar9->second).Size) {
      FormatString<char[26],char[74]>
                ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "BlockIt->first >= 0 && BlockIt->first + BlockIt->second.Size <= m_MaxSize",
                 (char (*) [74])this);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1c9);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&PrevBlockIt);
    if ((ppVar9->first & this->m_CurrAlignment - 1) != 0) {
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->(&PrevBlockIt);
      in_R8 = &this->m_CurrAlignment;
      FormatString<char[15],unsigned_long,char[10],unsigned_long,char[9]>
                ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Block offset (",
                 (char (*) [15])ppVar9,(unsigned_long *)") is not ",(char (*) [10])in_R8,
                 (unsigned_long *)0xe2fe9f,in_stack_fffffffffffffdc8);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1ca);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&PrevBlockIt);
    uVar3 = ppVar9->first;
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&PrevBlockIt);
    Args_1_00 = this;
    if (uVar3 + (ppVar9->second).Size < this->m_MaxSize) {
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->(&PrevBlockIt);
      Args_1_00 = (VariableSizeAllocationsManager *)(this->m_CurrAlignment - 1);
      if (((ppVar9->second).Size & (ulong)Args_1_00) != 0) {
        FormatString<char[49],unsigned_long,char[9]>
                  ((string *)((long)&msg_5.field_2 + 8),
                   (Diligent *)"All block sizes except for the last one must be ",
                   (char (*) [49])&this->m_CurrAlignment,(unsigned_long *)0xe2fe9f,
                   (char (*) [9])in_R8);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        Args_1_00 = (VariableSizeAllocationsManager *)0x1cc;
        DebugAssertionFailed
                  (pCVar6,"DbgVerifyList",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0x1cc);
        std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
      }
    }
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&PrevBlockIt);
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>
             ::operator->(&(ppVar9->second).OrderBySizeIt);
    bVar4 = std::operator==(&PrevBlockIt,&ppVar8->second);
    if (!bVar4) {
      FormatString<char[26],char[49]>
                ((string *)((long)&msg_6.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"BlockIt == BlockIt->second.OrderBySizeIt->second",
                 (char (*) [49])Args_1_00);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1cd);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
    }
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&PrevBlockIt);
    OVar1 = (ppVar9->second).Size;
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&PrevBlockIt);
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>
             ::operator->(&(ppVar9->second).OrderBySizeIt);
    if (OVar1 != ppVar8->first) {
      FormatString<char[26],char[61]>
                ((string *)local_120,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"BlockIt->second.Size == BlockIt->second.OrderBySizeIt->first",
                 (char (*) [61])ppVar8);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1ce);
      std::__cxx11::string::~string((string *)local_120);
    }
    msg_7.field_2._8_8_ =
         std::
         map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
         ::end(&this->m_FreeBlocksByOffset);
    bVar5 = std::operator==((_Self *)((long)&msg_1.field_2 + 8),(_Self *)((long)&msg_7.field_2 + 8))
    ;
    bVar4 = true;
    if (!bVar5) {
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->(&PrevBlockIt);
      uVar2 = ppVar9->first;
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
                             *)((long)&msg_1.field_2 + 8));
      uVar3 = ppVar9->first;
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
                             *)((long)&msg_1.field_2 + 8));
      bVar4 = uVar3 + (ppVar9->second).Size < uVar2;
    }
    if (!bVar4) {
      FormatString<char[49]>
                ((string *)&OrderIt,
                 (char (*) [49])"Unmerged adjacent or overlapping blocks detected");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1d3);
      std::__cxx11::string::~string((string *)&OrderIt);
    }
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&PrevBlockIt);
    msg.field_2._8_8_ = (ppVar9->second).Size + msg.field_2._8_8_;
    msg_1.field_2._8_8_ = PrevBlockIt._M_node;
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
    ::operator++(&PrevBlockIt);
  }
  local_150._M_node =
       (_Base_ptr)
       std::
       multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
       ::begin(&this->m_FreeBlocksBySize);
  while( true ) {
    msg_8.field_2._8_8_ =
         std::
         multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
         ::end(&this->m_FreeBlocksBySize);
    bVar4 = std::operator!=(&local_150,(_Self *)((long)&msg_8.field_2 + 8));
    if (!bVar4) break;
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>
             ::operator->(&local_150);
    uVar3 = ppVar8->first;
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>
             ::operator->(&local_150);
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&ppVar8->second);
    if (uVar3 != (ppVar9->second).Size) {
      FormatString<char[26],char[47]>
                ((string *)((long)&msg_9.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"OrderIt->first == OrderIt->second->second.Size",
                 (char (*) [47])ppVar9);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"DbgVerifyList",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x1dd);
      std::__cxx11::string::~string((string *)(msg_9.field_2._M_local_buf + 8));
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>
    ::operator++(&local_150);
  }
  if (msg.field_2._8_8_ != this->m_FreeSize) {
    FormatString<char[26],char[28]>
              ((string *)local_198,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"TotalFreeSize == m_FreeSize",(char (*) [28])this);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"DbgVerifyList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x1e1);
    std::__cxx11::string::~string((string *)local_198);
  }
  return;
}

Assistant:

void DbgVerifyList()
    {
        OffsetType TotalFreeSize = 0;

        VERIFY_EXPR(IsPowerOfTwo(m_CurrAlignment));
        auto BlockIt     = m_FreeBlocksByOffset.begin();
        auto PrevBlockIt = m_FreeBlocksByOffset.end();
        VERIFY_EXPR(m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size());
        while (BlockIt != m_FreeBlocksByOffset.end())
        {
            VERIFY_EXPR(BlockIt->first >= 0 && BlockIt->first + BlockIt->second.Size <= m_MaxSize);
            VERIFY((BlockIt->first & (m_CurrAlignment - 1)) == 0, "Block offset (", BlockIt->first, ") is not ", m_CurrAlignment, "-aligned");
            if (BlockIt->first + BlockIt->second.Size < m_MaxSize)
                VERIFY((BlockIt->second.Size & (m_CurrAlignment - 1)) == 0, "All block sizes except for the last one must be ", m_CurrAlignment, "-aligned");
            VERIFY_EXPR(BlockIt == BlockIt->second.OrderBySizeIt->second);
            VERIFY_EXPR(BlockIt->second.Size == BlockIt->second.OrderBySizeIt->first);
            //   PrevBlock.Offset                   BlockIt.first
            //     |                                  |
            // ~ ~ |<-----PrevBlock.Size----->| ~ ~ ~ |<------Size-------->| ~ ~ ~
            //
            VERIFY(PrevBlockIt == m_FreeBlocksByOffset.end() || BlockIt->first > PrevBlockIt->first + PrevBlockIt->second.Size, "Unmerged adjacent or overlapping blocks detected");
            TotalFreeSize += BlockIt->second.Size;

            PrevBlockIt = BlockIt;
            ++BlockIt;
        }

        auto OrderIt = m_FreeBlocksBySize.begin();
        while (OrderIt != m_FreeBlocksBySize.end())
        {
            VERIFY_EXPR(OrderIt->first == OrderIt->second->second.Size);
            ++OrderIt;
        }

        VERIFY_EXPR(TotalFreeSize == m_FreeSize);
    }